

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O1

double __thiscall HeuristicNeighbourhood::getFixingRate(HeuristicNeighbourhood *this)

{
  double *pdVar1;
  HighsDomain *pHVar2;
  ulong uVar3;
  pointer pHVar4;
  double dVar5;
  HighsInt col;
  int local_1c;
  
  pHVar2 = this->localdom;
  uVar3 = this->nCheckedChanges;
  pHVar4 = (pHVar2->domchgstack_).
           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)((long)(pHVar2->domchgstack_).
                            super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar4 >> 4)) {
    do {
      this->nCheckedChanges = uVar3 + 1;
      local_1c = pHVar4[uVar3].column;
      if ((pHVar2->mipsolver->model_->integrality_).
          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_start[local_1c] != kContinuous) {
        dVar5 = (pHVar2->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[local_1c];
        pdVar1 = (pHVar2->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + local_1c;
        if ((dVar5 == *pdVar1) && (!NAN(dVar5) && !NAN(*pdVar1))) {
          HighsHashTable<int,void>::insert<int&>
                    ((HighsHashTable<int,void> *)&this->fixedCols,&local_1c);
        }
      }
      pHVar2 = this->localdom;
      uVar3 = this->nCheckedChanges;
      pHVar4 = (pHVar2->domchgstack_).
               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(pHVar2->domchgstack_).
                                   super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar4 >> 4));
  }
  dVar5 = 0.0;
  if (this->numTotal != 0) {
    dVar5 = (double)(long)(this->fixedCols).numElements / (double)this->numTotal;
  }
  return dVar5;
}

Assistant:

double getFixingRate() {
    while (nCheckedChanges < localdom.getDomainChangeStack().size()) {
      HighsInt col = localdom.getDomainChangeStack()[nCheckedChanges++].column;
      if (localdom.variableType(col) == HighsVarType::kContinuous) continue;
      if (localdom.isFixed(col)) fixedCols.insert(col);
    }

    return numTotal ? static_cast<double>(fixedCols.size()) /
                          static_cast<double>(numTotal)
                    : 0.0;
  }